

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.cpp
# Opt level: O2

Element __thiscall ftxui::bgcolor(ftxui *this,Color color,Element *child)

{
  pointer p_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  Element EVar2;
  __allocator_type __a2;
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<ftxui::(anonymous_namespace)::BgColor,_std::allocator<ftxui::(anonymous_namespace)::BgColor>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_78;
  undefined8 local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_60;
  Element local_58;
  undefined8 local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  local_40 = 0;
  p_Var1 = (pointer)operator_new(0x70);
  local_78._M_alloc = &__a2;
  (p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
  (p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
  (p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_0011e788;
  local_58.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (child->super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_58.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (child->super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (child->super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0;
  (child->super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_68 = 0;
  _Stack_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_78._M_ptr = p_Var1;
  NodeDecorator::NodeDecorator((NodeDecorator *)&p_Var1->_M_impl,&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_58.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  (p_Var1->_M_impl)._M_storage._M_storage.__align =
       (anon_struct_8_0_00000001_for___align)&PTR__Node_0011e7d8;
  *(Color *)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x5c) = color;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_60);
  local_78._M_ptr = (pointer)0x0;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<ftxui::(anonymous_namespace)::BgColor,_std::allocator<ftxui::(anonymous_namespace)::BgColor>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr(&local_78);
  *(_Impl **)this = &p_Var1->_M_impl;
  local_38._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(pointer *)(this + 8) = p_Var1;
  local_40 = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
  EVar2.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  EVar2.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Element)EVar2.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Element bgcolor(Color color, Element child) {
  return std::make_shared<BgColor>(std::move(child), color);
}